

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscTests.cpp
# Opt level: O3

void __thiscall agge::tests::MiscTests::AddingVectorToAPointShiftsIt(MiscTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string local_70;
  point<float> local_50;
  point<float> local_48;
  LocationInfo local_40;
  
  local_48.x = -0.50200003;
  local_48.y = 363.6;
  local_50.x = -0.50200003;
  local_50.y = 363.6;
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_40,&local_70,0x72);
  ut::are_equal<agge::point<float>,agge::point<float>>(&local_48,&local_50,&local_40);
  paVar2 = &local_40.filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_40.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_48.x = 6.4979997;
  local_48.y = 317.6;
  local_50.x = 6.4979997;
  local_50.y = 317.6;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_40,&local_70,0x73);
  ut::are_equal<agge::point<float>,agge::point<float>>(&local_48,&local_50,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_40.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_48.x = 71.899994;
  local_48.y = 40.31;
  local_50.x = 71.899994;
  local_50.y = 40.31;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_40,&local_70,0x74);
  ut::are_equal<agge::point<float>,agge::point<float>>(&local_48,&local_50,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_40.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_48.x = 78.899994;
  local_48.y = -5.6900005;
  local_50.x = 78.899994;
  local_50.y = -5.6900005;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_40,&local_70,0x75);
  ut::are_equal<agge::point<float>,agge::point<float>>(&local_48,&local_50,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_40.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_40,&local_70,0x77);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_40.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_40,&local_70,0x78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_40.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_40,&local_70,0x79);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_40.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_40,&local_70,0x7a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_40.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

test( AddingVectorToAPointShiftsIt )
			{
				// INIT
				const point_r p1 = { -1.202f, 311.9f }, p2 = { 71.2f, -11.39f };
				const point<int> p3 = { -9, 13 }, p4 = { 911, 1978 };
				const vector_r v1 = { 0.7f, 51.7f }, v2 = { 7.7f, 5.7f };
				const agge_vector<int> v3 = { 81, -171 }, v4 = { -7, 19 };

				// ACT / ASSERT
				assert_equal(create_point(-1.202f + 0.7f, 311.9f + 51.7f), p1 + v1);
				assert_equal(create_point(-1.202f + 7.7f, 311.9f + 5.7f), p1 + v2);
				assert_equal(create_point(71.2f + 0.7f, -11.39f + 51.7f), p2 + v1);
				assert_equal(create_point(71.2f + 7.7f, -11.39f + 5.7f), p2 + v2);

				assert_equal(create_point(-9 + 81, 13 + -171), p3 + v3);
				assert_equal(create_point(-9 + -7, 13 + 19), p3 + v4);
				assert_equal(create_point(911 + 81, 1978 + -171), p4 + v3);
				assert_equal(create_point(911 + -7, 1978 + 19), p4 + v4);
			}